

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_sse2.c
# Opt level: O0

void av1_convolve_2d_sr_sse2
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  char cVar4;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  uint uVar45;
  int iVar46;
  int16_t *piVar47;
  undefined1 (*pauVar48) [16];
  undefined8 *puVar49;
  int in_ECX;
  long lVar50;
  int iVar51;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  InterpFilterParams *in_stack_00000008;
  InterpFilterParams *in_stack_00000010;
  uint in_stack_00000018;
  uint in_stack_00000020;
  __m128i *p;
  __m128i res_8;
  __m128i res16;
  __m128i res_hi_round;
  __m128i res_lo_round;
  __m128i res_hi;
  __m128i res_lo;
  __m128i res_odd_1;
  __m128i res_7_1;
  __m128i res_5_1;
  __m128i res_3_1;
  __m128i res_1_1;
  __m128i src_7_1;
  __m128i src_5_1;
  __m128i src_3_1;
  __m128i src_1_1;
  __m128i res_even_1;
  __m128i res_6_1;
  __m128i res_4_1;
  __m128i res_2_1;
  __m128i res_0_1;
  __m128i src_6_1;
  __m128i src_4_1;
  __m128i src_2_1;
  __m128i src_0_1;
  int16_t *data_1;
  __m128i round_shift_1;
  __m128i round_const_1;
  __m128i sum_shift;
  __m128i sum_round;
  __m128i coeff_67_1;
  __m128i coeff_45_1;
  __m128i coeff_23_1;
  __m128i coeff_01_1;
  __m128i tmp_1_1;
  __m128i tmp_0_1;
  __m128i coeffs_y;
  int16_t *y_filter;
  __m128i res;
  __m128i res_odd;
  __m128i res_7;
  __m128i src_7;
  __m128i res_5;
  __m128i src_5;
  __m128i res_3;
  __m128i src_3;
  __m128i res_1;
  __m128i src_1;
  __m128i res_even;
  __m128i res_6;
  __m128i src_6;
  __m128i res_4;
  __m128i src_4;
  __m128i res_2;
  __m128i src_2;
  __m128i res_0;
  __m128i src_0;
  __m128i data;
  __m128i round_shift;
  __m128i round_const;
  __m128i coeff_67;
  __m128i coeff_45;
  __m128i coeff_23;
  __m128i coeff_01;
  __m128i tmp_1;
  __m128i tmp_0;
  __m128i coeffs_x;
  int16_t *x_filter;
  int offset_bits;
  int bits;
  __m128i zero;
  uint8_t *src_ptr;
  int fo_horiz;
  int fo_vert;
  int j;
  int i;
  int im_stride;
  int im_h;
  int16_t im_block [17792];
  int bd;
  undefined8 local_9878;
  undefined8 local_9868;
  undefined8 local_9858;
  undefined8 local_9848;
  undefined8 local_97f8;
  undefined8 uStack_97f0;
  undefined8 local_9698;
  undefined8 local_9688;
  undefined8 local_9678;
  undefined8 local_9668;
  byte local_9620;
  byte local_961c;
  int local_95f8;
  int local_95f4;
  undefined8 local_95e8 [32];
  undefined8 auStack_94e8 [32];
  undefined8 auStack_93e8 [32];
  undefined8 auStack_92e8 [32];
  undefined8 auStack_91e8 [32];
  undefined8 auStack_90e8 [32];
  undefined8 auStack_8fe8 [32];
  undefined8 auStack_8ee8 [4091];
  int in_stack_fffffffffffff0f4;
  int in_stack_fffffffffffff0f8;
  int in_stack_fffffffffffff0fc;
  uint8_t *in_stack_fffffffffffff100;
  int in_stack_fffffffffffff10c;
  uint8_t *in_stack_fffffffffffff110;
  InterpFilterParams *in_stack_fffffffffffff120;
  InterpFilterParams *in_stack_fffffffffffff128;
  int in_stack_fffffffffffff130;
  int in_stack_fffffffffffff138;
  ConvolveParams *in_stack_fffffffffffff140;
  undefined4 uStack_a64;
  undefined4 local_a58;
  undefined8 in_stack_fffffffffffff5b8;
  undefined8 in_stack_fffffffffffff5c0;
  undefined4 uVar59;
  uint8_t *in_stack_fffffffffffff5c8;
  undefined4 uVar60;
  undefined8 in_stack_fffffffffffff5d0;
  uint8_t *in_stack_fffffffffffff5d8;
  undefined4 uStack_9fc;
  undefined4 uStack_9f0;
  undefined4 uStack_9d0;
  undefined4 uStack_9cc;
  undefined4 uStack_940;
  undefined4 uStack_930;
  undefined4 uStack_920;
  undefined4 uStack_910;
  undefined4 uStack_900;
  undefined4 uStack_8f0;
  undefined4 uStack_8e0;
  undefined4 uStack_8d0;
  ulong local_8b8;
  ulong local_898;
  ulong local_878;
  byte local_848;
  undefined1 uStack_847;
  undefined1 uStack_846;
  undefined1 uStack_845;
  byte bStack_844;
  undefined1 uStack_843;
  undefined1 uStack_842;
  undefined1 uStack_841;
  byte local_828;
  undefined1 uStack_827;
  undefined1 uStack_826;
  undefined1 uStack_825;
  byte bStack_824;
  undefined1 uStack_823;
  undefined1 uStack_822;
  undefined1 uStack_821;
  byte local_808;
  undefined1 uStack_807;
  undefined1 uStack_806;
  undefined1 uStack_805;
  byte bStack_804;
  undefined1 uStack_803;
  undefined1 uStack_802;
  undefined1 uStack_801;
  byte local_7e8;
  undefined1 uStack_7e7;
  undefined1 uStack_7e6;
  undefined1 uStack_7e5;
  byte bStack_7e4;
  undefined1 uStack_7e3;
  undefined1 uStack_7e2;
  undefined1 uStack_7e1;
  byte local_7c8;
  undefined1 uStack_7c7;
  undefined1 uStack_7c6;
  undefined1 uStack_7c5;
  byte bStack_7c4;
  undefined1 uStack_7c3;
  undefined1 uStack_7c2;
  undefined1 uStack_7c1;
  byte local_7a8;
  undefined1 uStack_7a7;
  undefined1 uStack_7a6;
  undefined1 uStack_7a5;
  byte bStack_7a4;
  undefined1 uStack_7a3;
  undefined1 uStack_7a2;
  undefined1 uStack_7a1;
  byte local_788;
  undefined1 uStack_787;
  undefined1 uStack_786;
  undefined1 uStack_785;
  byte bStack_784;
  undefined1 uStack_783;
  undefined1 uStack_782;
  undefined1 uStack_781;
  byte local_768;
  undefined1 uStack_767;
  undefined1 uStack_766;
  undefined1 uStack_765;
  byte bStack_764;
  undefined1 uStack_763;
  undefined1 uStack_762;
  undefined1 uStack_761;
  int iStack_52c;
  int local_4b8;
  int iStack_4b4;
  int iStack_4b0;
  int iStack_4ac;
  int local_4a8;
  int iStack_4a4;
  int iStack_4a0;
  int iStack_49c;
  int local_498;
  int iStack_494;
  int iStack_490;
  int iStack_48c;
  int local_488;
  int iStack_484;
  int iStack_480;
  int iStack_47c;
  int local_458;
  int iStack_454;
  int iStack_450;
  int iStack_44c;
  int local_448;
  int iStack_444;
  int iStack_440;
  int iStack_43c;
  int local_438;
  int iStack_434;
  int iStack_430;
  int iStack_42c;
  int local_428;
  int iStack_424;
  int iStack_420;
  int iStack_41c;
  int local_3d8;
  int iStack_3d4;
  int iStack_3d0;
  int iStack_3cc;
  int local_3c8;
  int iStack_3c4;
  int iStack_3c0;
  int iStack_3bc;
  int local_3b8;
  int iStack_3b4;
  int iStack_3b0;
  int iStack_3ac;
  int local_3a8;
  int iStack_3a4;
  int iStack_3a0;
  int iStack_39c;
  int local_358;
  int iStack_354;
  int iStack_350;
  int iStack_34c;
  int local_348;
  int iStack_344;
  int iStack_340;
  int iStack_33c;
  int local_338;
  int iStack_334;
  int iStack_330;
  int iStack_32c;
  int local_328;
  int iStack_324;
  int iStack_320;
  int iStack_31c;
  undefined2 local_1f8;
  undefined2 uStack_1f6;
  undefined2 uStack_1f4;
  undefined2 uStack_1f2;
  undefined2 local_1e8;
  undefined2 uStack_1e6;
  undefined2 uStack_1e4;
  undefined2 uStack_1e2;
  undefined2 local_1d8;
  undefined2 uStack_1d6;
  undefined2 uStack_1d4;
  undefined2 uStack_1d2;
  undefined2 local_1c8;
  undefined2 uStack_1c6;
  undefined2 uStack_1c4;
  undefined2 uStack_1c2;
  undefined2 local_1b8;
  undefined2 uStack_1b6;
  undefined2 uStack_1b4;
  undefined2 uStack_1b2;
  undefined2 local_1a8;
  undefined2 uStack_1a6;
  undefined2 uStack_1a4;
  undefined2 uStack_1a2;
  undefined2 local_198;
  undefined2 uStack_196;
  undefined2 uStack_194;
  undefined2 uStack_192;
  undefined2 local_188;
  undefined2 uStack_186;
  undefined2 uStack_184;
  undefined2 uStack_182;
  undefined2 uStack_170;
  undefined2 uStack_16e;
  undefined2 uStack_16c;
  undefined2 uStack_16a;
  undefined2 uStack_160;
  undefined2 uStack_15e;
  undefined2 uStack_15c;
  undefined2 uStack_15a;
  undefined2 uStack_150;
  undefined2 uStack_14e;
  undefined2 uStack_14c;
  undefined2 uStack_14a;
  undefined2 uStack_140;
  undefined2 uStack_13e;
  undefined2 uStack_13c;
  undefined2 uStack_13a;
  undefined2 uStack_130;
  undefined2 uStack_12e;
  undefined2 uStack_12c;
  undefined2 uStack_12a;
  undefined2 uStack_120;
  undefined2 uStack_11e;
  undefined2 uStack_11c;
  undefined2 uStack_11a;
  undefined2 uStack_110;
  undefined2 uStack_10e;
  undefined2 uStack_10c;
  undefined2 uStack_10a;
  undefined2 uStack_100;
  undefined2 uStack_fe;
  undefined2 uStack_fc;
  undefined2 uStack_fa;
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  undefined2 local_14;
  undefined2 uStack_12;
  char cVar5;
  char cVar6;
  char cVar7;
  
  if (in_stack_00000008->taps < 9) {
    uVar1 = in_stack_00000010->taps;
    uVar2 = in_stack_00000010->taps;
    uVar3 = in_stack_00000008->taps;
    uVar45 = 0xe - (*(int *)((long)p[1] + 4) + (int)p[1][1]);
    local_9620 = 0x16 - (char)*(undefined4 *)((long)p[1] + 4);
    piVar47 = av1_get_interp_filter_subpel_kernel(in_stack_00000008,in_stack_00000018 & 0xf);
    uVar59 = (undefined4)*(undefined8 *)piVar47;
    uVar60 = (undefined4)((ulong)*(undefined8 *)piVar47 >> 0x20);
    uStack_9d0 = (undefined4)*(undefined8 *)(piVar47 + 4);
    uStack_9cc = (undefined4)((ulong)*(undefined8 *)(piVar47 + 4) >> 0x20);
    uVar9 = CONCAT44(uVar59,uVar59);
    local_9668 = CONCAT44(uVar60,uStack_8e0);
    local_9688 = CONCAT44(uStack_9cc,uStack_900);
    iVar46 = ((1 << (*(byte *)((long)p[1] + 4) & 0x1f)) >> 1) + 0x4000;
    local_878 = CONCAT44(0,*(uint *)((long)p[1] + 4));
    for (local_95f4 = 0; local_95f4 < (int)(in_R9D + -1 + (uint)uVar1); local_95f4 = local_95f4 + 1)
    {
      for (local_95f8 = 0; local_95f8 < in_R8D; local_95f8 = local_95f8 + 8) {
        pauVar48 = (undefined1 (*) [16])
                   (((in_RDI - (int)(((uVar2 >> 1) - 1) * in_ESI)) - (long)(int)((uVar3 >> 1) - 1))
                   + (long)(local_95f4 * in_ESI + local_95f8));
        uVar8 = *(undefined8 *)*pauVar48;
        auVar43 = *pauVar48;
        auVar39 = *pauVar48;
        auVar57 = *pauVar48;
        auVar58 = *pauVar48;
        auVar55 = *pauVar48;
        auVar54 = *pauVar48;
        auVar53 = *pauVar48;
        local_768 = (byte)uVar8;
        uStack_767 = (undefined1)((ulong)uVar8 >> 8);
        uStack_766 = (undefined1)((ulong)uVar8 >> 0x10);
        uStack_765 = (undefined1)((ulong)uVar8 >> 0x18);
        bStack_764 = (byte)((ulong)uVar8 >> 0x20);
        uStack_763 = (undefined1)((ulong)uVar8 >> 0x28);
        uStack_762 = (undefined1)((ulong)uVar8 >> 0x30);
        uStack_761 = (undefined1)((ulong)uVar8 >> 0x38);
        auVar34[1] = 0;
        auVar34[0] = local_768;
        auVar34[2] = uStack_767;
        auVar34[3] = 0;
        auVar34[4] = uStack_766;
        auVar34[5] = 0;
        auVar34[6] = uStack_765;
        auVar34[7] = 0;
        auVar34[9] = 0;
        auVar34[8] = bStack_764;
        auVar34[10] = uStack_763;
        auVar34[0xb] = 0;
        auVar34[0xc] = uStack_762;
        auVar34[0xd] = 0;
        auVar34[0xe] = uStack_761;
        auVar34[0xf] = 0;
        auVar33._8_8_ = uVar9;
        auVar33._0_8_ = local_9668;
        auVar52 = pmaddwd(auVar34,auVar33);
        local_788 = auVar53[2];
        uStack_787 = auVar53[3];
        uStack_786 = auVar53[4];
        uStack_785 = auVar53[5];
        bStack_784 = auVar53[6];
        uStack_783 = auVar53[7];
        uStack_782 = auVar53[8];
        uStack_781 = auVar53[9];
        auVar32[1] = 0;
        auVar32[0] = local_788;
        auVar32[2] = uStack_787;
        auVar32[3] = 0;
        auVar32[4] = uStack_786;
        auVar32[5] = 0;
        auVar32[6] = uStack_785;
        auVar32[7] = 0;
        auVar32[9] = 0;
        auVar32[8] = bStack_784;
        auVar32[10] = uStack_783;
        auVar32[0xb] = 0;
        auVar32[0xc] = uStack_782;
        auVar32[0xd] = 0;
        auVar32[0xe] = uStack_781;
        auVar31._12_4_ = uVar60;
        auVar31._8_4_ = uStack_8d0;
        auVar32[0xf] = 0;
        auVar31._0_8_ = local_9678;
        auVar53 = pmaddwd(auVar32,auVar31);
        local_7a8 = auVar54[4];
        uStack_7a7 = auVar54[5];
        uStack_7a6 = auVar54[6];
        uStack_7a5 = auVar54[7];
        bStack_7a4 = auVar54[8];
        uStack_7a3 = auVar54[9];
        uStack_7a2 = auVar54[10];
        uStack_7a1 = auVar54[0xb];
        auVar30[1] = 0;
        auVar30[0] = local_7a8;
        auVar30[2] = uStack_7a7;
        auVar30[3] = 0;
        auVar30[4] = uStack_7a6;
        auVar30[5] = 0;
        auVar30[6] = uStack_7a5;
        auVar30[7] = 0;
        auVar30[9] = 0;
        auVar30[8] = bStack_7a4;
        auVar30[10] = uStack_7a3;
        auVar30[0xb] = 0;
        auVar30[0xc] = uStack_7a2;
        auVar30[0xd] = 0;
        auVar30[0xe] = uStack_7a1;
        auVar30[0xf] = 0;
        auVar29._8_8_ = CONCAT44(uStack_9d0,uStack_9d0);
        auVar29._0_8_ = local_9688;
        auVar54 = pmaddwd(auVar30,auVar29);
        local_7c8 = auVar55[6];
        uStack_7c7 = auVar55[7];
        uStack_7c6 = auVar55[8];
        uStack_7c5 = auVar55[9];
        bStack_7c4 = auVar55[10];
        uStack_7c3 = auVar55[0xb];
        uStack_7c2 = auVar55[0xc];
        uStack_7c1 = auVar55[0xd];
        auVar28[1] = 0;
        auVar28[0] = local_7c8;
        auVar28[2] = uStack_7c7;
        auVar28[3] = 0;
        auVar28[4] = uStack_7c6;
        auVar28[5] = 0;
        auVar28[6] = uStack_7c5;
        auVar28[7] = 0;
        auVar28[9] = 0;
        auVar28[8] = bStack_7c4;
        auVar28[10] = uStack_7c3;
        auVar28[0xb] = 0;
        auVar28[0xc] = uStack_7c2;
        auVar28[0xd] = 0;
        auVar28[0xe] = uStack_7c1;
        auVar27._12_4_ = uStack_9cc;
        auVar27._8_4_ = uStack_8f0;
        auVar28[0xf] = 0;
        auVar27._0_8_ = local_9698;
        auVar55 = pmaddwd(auVar28,auVar27);
        local_328 = auVar52._0_4_;
        iStack_324 = auVar52._4_4_;
        iStack_320 = auVar52._8_4_;
        iStack_31c = auVar52._12_4_;
        local_338 = auVar54._0_4_;
        iStack_334 = auVar54._4_4_;
        iStack_330 = auVar54._8_4_;
        iStack_32c = auVar54._12_4_;
        local_348 = auVar53._0_4_;
        iStack_344 = auVar53._4_4_;
        iStack_340 = auVar53._8_4_;
        iStack_33c = auVar53._12_4_;
        local_358 = auVar55._0_4_;
        iStack_354 = auVar55._4_4_;
        iStack_350 = auVar55._8_4_;
        iStack_34c = auVar55._12_4_;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = local_878;
        local_7e8 = auVar58[1];
        uStack_7e7 = auVar58[2];
        uStack_7e6 = auVar58[3];
        uStack_7e5 = auVar58[4];
        bStack_7e4 = auVar58[5];
        uStack_7e3 = auVar58[6];
        uStack_7e2 = auVar58[7];
        uStack_7e1 = auVar58[8];
        auVar26[1] = 0;
        auVar26[0] = local_7e8;
        auVar26[2] = uStack_7e7;
        auVar26[3] = 0;
        auVar26[4] = uStack_7e6;
        auVar26[5] = 0;
        auVar26[6] = uStack_7e5;
        auVar26[7] = 0;
        auVar26[9] = 0;
        auVar26[8] = bStack_7e4;
        auVar26[10] = uStack_7e3;
        auVar26[0xb] = 0;
        auVar26[0xc] = uStack_7e2;
        auVar26[0xd] = 0;
        auVar26[0xe] = uStack_7e1;
        auVar26[0xf] = 0;
        auVar56._8_8_ = uVar9;
        auVar56._0_8_ = local_9668;
        auVar56 = pmaddwd(auVar26,auVar56);
        local_808 = auVar57[3];
        uStack_807 = auVar57[4];
        uStack_806 = auVar57[5];
        uStack_805 = auVar57[6];
        bStack_804 = auVar57[7];
        uStack_803 = auVar57[8];
        uStack_802 = auVar57[9];
        uStack_801 = auVar57[10];
        auVar52[1] = 0;
        auVar52[0] = local_808;
        auVar52[2] = uStack_807;
        auVar52[3] = 0;
        auVar52[4] = uStack_806;
        auVar52[5] = 0;
        auVar52[6] = uStack_805;
        auVar52[7] = 0;
        auVar52[9] = 0;
        auVar52[8] = bStack_804;
        auVar52[10] = uStack_803;
        auVar52[0xb] = 0;
        auVar52[0xc] = uStack_802;
        auVar52[0xd] = 0;
        auVar52[0xe] = uStack_801;
        auVar57._12_4_ = uVar60;
        auVar57._8_4_ = uStack_8d0;
        auVar52[0xf] = 0;
        auVar57._0_8_ = local_9678;
        auVar57 = pmaddwd(auVar52,auVar57);
        local_828 = auVar39[5];
        uStack_827 = auVar39[6];
        uStack_826 = auVar39[7];
        uStack_825 = auVar39[8];
        bStack_824 = auVar39[9];
        uStack_823 = auVar39[10];
        uStack_822 = auVar39[0xb];
        uStack_821 = auVar39[0xc];
        auVar58[1] = 0;
        auVar58[0] = local_828;
        auVar58[2] = uStack_827;
        auVar58[3] = 0;
        auVar58[4] = uStack_826;
        auVar58[5] = 0;
        auVar58[6] = uStack_825;
        auVar58[7] = 0;
        auVar58[9] = 0;
        auVar58[8] = bStack_824;
        auVar58[10] = uStack_823;
        auVar58[0xb] = 0;
        auVar58[0xc] = uStack_822;
        auVar58[0xd] = 0;
        auVar58[0xe] = uStack_821;
        auVar58[0xf] = 0;
        auVar55._8_8_ = CONCAT44(uStack_9d0,uStack_9d0);
        auVar55._0_8_ = local_9688;
        auVar55 = pmaddwd(auVar58,auVar55);
        local_848 = auVar43[7];
        uStack_847 = auVar43[8];
        uStack_846 = auVar43[9];
        uStack_845 = auVar43[10];
        bStack_844 = auVar43[0xb];
        uStack_843 = auVar43[0xc];
        uStack_842 = auVar43[0xd];
        uStack_841 = auVar43[0xe];
        auVar54[1] = 0;
        auVar54[0] = local_848;
        auVar54[2] = uStack_847;
        auVar54[3] = 0;
        auVar54[4] = uStack_846;
        auVar54[5] = 0;
        auVar54[6] = uStack_845;
        auVar54[7] = 0;
        auVar54[9] = 0;
        auVar54[8] = bStack_844;
        auVar54[10] = uStack_843;
        auVar54[0xb] = 0;
        auVar54[0xc] = uStack_842;
        auVar54[0xd] = 0;
        auVar54[0xe] = uStack_841;
        auVar53._12_4_ = uStack_9cc;
        auVar53._8_4_ = uStack_8f0;
        auVar54[0xf] = 0;
        auVar53._0_8_ = local_9698;
        auVar53 = pmaddwd(auVar54,auVar53);
        local_3a8 = auVar56._0_4_;
        iStack_3a4 = auVar56._4_4_;
        iStack_3a0 = auVar56._8_4_;
        iStack_39c = auVar56._12_4_;
        local_3b8 = auVar55._0_4_;
        iStack_3b4 = auVar55._4_4_;
        iStack_3b0 = auVar55._8_4_;
        iStack_3ac = auVar55._12_4_;
        local_3c8 = auVar57._0_4_;
        iStack_3c4 = auVar57._4_4_;
        iStack_3c0 = auVar57._8_4_;
        iStack_3bc = auVar57._12_4_;
        local_3d8 = auVar53._0_4_;
        iStack_3d4 = auVar53._4_4_;
        iStack_3d0 = auVar53._8_4_;
        iStack_3cc = auVar53._12_4_;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = local_878;
        auVar44._4_4_ = iStack_324 + iStack_334 + iStack_344 + iStack_354 + iVar46 >> auVar40;
        auVar44._0_4_ = local_328 + local_338 + local_348 + local_358 + iVar46 >> auVar40;
        auVar44._12_4_ = iStack_31c + iStack_32c + iStack_33c + iStack_34c + iVar46 >> auVar40;
        auVar44._8_4_ = iStack_320 + iStack_330 + iStack_340 + iStack_350 + iVar46 >> auVar40;
        auVar43._4_4_ = iStack_3a4 + iStack_3b4 + iStack_3c4 + iStack_3d4 + iVar46 >> auVar39;
        auVar43._0_4_ = local_3a8 + local_3b8 + local_3c8 + local_3d8 + iVar46 >> auVar39;
        auVar43._12_4_ = iStack_39c + iStack_3ac + iStack_3bc + iStack_3cc + iVar46 >> auVar39;
        auVar43._8_4_ = iStack_3a0 + iStack_3b0 + iStack_3c0 + iStack_3d0 + iVar46 >> auVar39;
        auVar53 = packssdw(auVar44,auVar43);
        lVar50 = (long)(local_95f4 * 0x80 + local_95f8) * 2;
        local_97f8 = auVar53._0_8_;
        uStack_97f0 = auVar53._8_8_;
        *(undefined8 *)((long)local_95e8 + lVar50) = local_97f8;
        *(undefined8 *)((long)local_95e8 + lVar50 + 8) = uStack_97f0;
      }
    }
    piVar47 = av1_get_interp_filter_subpel_kernel(in_stack_00000010,in_stack_00000020 & 0xf);
    local_a58 = (undefined4)*(undefined8 *)piVar47;
    uStack_a64 = (undefined4)((ulong)*(undefined8 *)piVar47 >> 0x20);
    uStack_9f0 = (undefined4)*(undefined8 *)(piVar47 + 4);
    uStack_9fc = (undefined4)((ulong)*(undefined8 *)(piVar47 + 4) >> 0x20);
    local_9848 = CONCAT44(uStack_a64,uStack_920);
    local_9868 = CONCAT44(uStack_9fc,uStack_940);
    iVar46 = (1 << (local_9620 & 0x1f)) + ((1 << ((byte)p[1][1] & 0x1f)) >> 1);
    local_898 = CONCAT44(0,(uint)p[1][1]);
    local_961c = (byte)uVar45;
    iVar51 = 1 << (local_9620 - (char)(int)p[1][1] & 0x1f);
    iVar51 = (((1 << (local_961c & 0x1f)) >> 1) - iVar51) - (iVar51 >> 1);
    local_14 = (undefined2)iVar51;
    uStack_12 = (undefined2)((uint)iVar51 >> 0x10);
    local_8b8 = CONCAT44(0,uVar45);
    for (local_95f4 = 0; local_95f4 < in_R9D; local_95f4 = local_95f4 + 1) {
      for (local_95f8 = 0; local_95f8 < in_R8D; local_95f8 = local_95f8 + 8) {
        lVar50 = (long)(local_95f4 * 0x80 + local_95f8) * 2;
        uVar9 = *(undefined8 *)((long)local_95e8 + lVar50);
        uVar8 = *(undefined8 *)((long)auStack_94e8 + lVar50);
        local_188 = (undefined2)uVar9;
        uStack_186 = (undefined2)((ulong)uVar9 >> 0x10);
        uStack_184 = (undefined2)((ulong)uVar9 >> 0x20);
        uStack_182 = (undefined2)((ulong)uVar9 >> 0x30);
        local_198 = (undefined2)uVar8;
        uStack_196 = (undefined2)((ulong)uVar8 >> 0x10);
        uStack_194 = (undefined2)((ulong)uVar8 >> 0x20);
        uStack_192 = (undefined2)((ulong)uVar8 >> 0x30);
        uVar9 = *(undefined8 *)((long)auStack_93e8 + lVar50);
        uVar8 = *(undefined8 *)((long)auStack_92e8 + lVar50);
        local_1a8 = (undefined2)uVar9;
        uStack_1a6 = (undefined2)((ulong)uVar9 >> 0x10);
        uStack_1a4 = (undefined2)((ulong)uVar9 >> 0x20);
        uStack_1a2 = (undefined2)((ulong)uVar9 >> 0x30);
        local_1b8 = (undefined2)uVar8;
        uStack_1b6 = (undefined2)((ulong)uVar8 >> 0x10);
        uStack_1b4 = (undefined2)((ulong)uVar8 >> 0x20);
        uStack_1b2 = (undefined2)((ulong)uVar8 >> 0x30);
        uVar9 = *(undefined8 *)((long)auStack_91e8 + lVar50);
        uVar8 = *(undefined8 *)((long)auStack_90e8 + lVar50);
        local_1c8 = (undefined2)uVar9;
        uStack_1c6 = (undefined2)((ulong)uVar9 >> 0x10);
        uStack_1c4 = (undefined2)((ulong)uVar9 >> 0x20);
        uStack_1c2 = (undefined2)((ulong)uVar9 >> 0x30);
        local_1d8 = (undefined2)uVar8;
        uStack_1d6 = (undefined2)((ulong)uVar8 >> 0x10);
        uStack_1d4 = (undefined2)((ulong)uVar8 >> 0x20);
        uStack_1d2 = (undefined2)((ulong)uVar8 >> 0x30);
        uVar9 = *(undefined8 *)((long)auStack_8fe8 + lVar50);
        uVar8 = *(undefined8 *)((long)auStack_8ee8 + lVar50);
        local_1e8 = (undefined2)uVar9;
        uStack_1e6 = (undefined2)((ulong)uVar9 >> 0x10);
        uStack_1e4 = (undefined2)((ulong)uVar9 >> 0x20);
        uStack_1e2 = (undefined2)((ulong)uVar9 >> 0x30);
        local_1f8 = (undefined2)uVar8;
        uStack_1f6 = (undefined2)((ulong)uVar8 >> 0x10);
        uStack_1f4 = (undefined2)((ulong)uVar8 >> 0x20);
        uStack_1f2 = (undefined2)((ulong)uVar8 >> 0x30);
        auVar25._2_2_ = local_198;
        auVar25._0_2_ = local_188;
        auVar25._4_2_ = uStack_186;
        auVar25._6_2_ = uStack_196;
        auVar25._10_2_ = uStack_194;
        auVar25._8_2_ = uStack_184;
        auVar25._12_2_ = uStack_182;
        auVar25._14_2_ = uStack_192;
        auVar24._8_8_ = CONCAT44(local_a58,local_a58);
        auVar24._0_8_ = local_9848;
        auVar53 = pmaddwd(auVar25,auVar24);
        auVar23._2_2_ = local_1b8;
        auVar23._0_2_ = local_1a8;
        auVar23._4_2_ = uStack_1a6;
        auVar23._6_2_ = uStack_1b6;
        auVar23._10_2_ = uStack_1b4;
        auVar23._8_2_ = uStack_1a4;
        auVar23._12_2_ = uStack_1a2;
        auVar23._14_2_ = uStack_1b2;
        auVar22._12_4_ = uStack_a64;
        auVar22._8_4_ = uStack_910;
        auVar22._0_8_ = local_9858;
        auVar54 = pmaddwd(auVar23,auVar22);
        auVar21._2_2_ = local_1d8;
        auVar21._0_2_ = local_1c8;
        auVar21._4_2_ = uStack_1c6;
        auVar21._6_2_ = uStack_1d6;
        auVar21._10_2_ = uStack_1d4;
        auVar21._8_2_ = uStack_1c4;
        auVar21._12_2_ = uStack_1c2;
        auVar21._14_2_ = uStack_1d2;
        auVar20._8_8_ = CONCAT44(uStack_9f0,uStack_9f0);
        auVar20._0_8_ = local_9868;
        auVar55 = pmaddwd(auVar21,auVar20);
        auVar19._2_2_ = local_1f8;
        auVar19._0_2_ = local_1e8;
        auVar19._4_2_ = uStack_1e6;
        auVar19._6_2_ = uStack_1f6;
        auVar19._10_2_ = uStack_1f4;
        auVar19._8_2_ = uStack_1e4;
        auVar19._12_2_ = uStack_1e2;
        auVar19._14_2_ = uStack_1f2;
        auVar18._12_4_ = uStack_9fc;
        auVar18._8_4_ = uStack_930;
        auVar18._0_8_ = local_9878;
        auVar58 = pmaddwd(auVar19,auVar18);
        local_428 = auVar53._0_4_;
        iStack_424 = auVar53._4_4_;
        iStack_420 = auVar53._8_4_;
        iStack_41c = auVar53._12_4_;
        local_438 = auVar54._0_4_;
        iStack_434 = auVar54._4_4_;
        iStack_430 = auVar54._8_4_;
        iStack_42c = auVar54._12_4_;
        local_448 = auVar55._0_4_;
        iStack_444 = auVar55._4_4_;
        iStack_440 = auVar55._8_4_;
        iStack_43c = auVar55._12_4_;
        local_458 = auVar58._0_4_;
        iStack_454 = auVar58._4_4_;
        iStack_450 = auVar58._8_4_;
        iStack_44c = auVar58._12_4_;
        uVar9 = *(undefined8 *)((long)local_95e8 + lVar50 + 8);
        uVar8 = *(undefined8 *)((long)auStack_94e8 + lVar50 + 8);
        uStack_100 = (undefined2)uVar9;
        uStack_fe = (undefined2)((ulong)uVar9 >> 0x10);
        uStack_fc = (undefined2)((ulong)uVar9 >> 0x20);
        uStack_fa = (undefined2)((ulong)uVar9 >> 0x30);
        uStack_110 = (undefined2)uVar8;
        uStack_10e = (undefined2)((ulong)uVar8 >> 0x10);
        uStack_10c = (undefined2)((ulong)uVar8 >> 0x20);
        uStack_10a = (undefined2)((ulong)uVar8 >> 0x30);
        uVar9 = *(undefined8 *)((long)auStack_93e8 + lVar50 + 8);
        uVar8 = *(undefined8 *)((long)auStack_92e8 + lVar50 + 8);
        uStack_120 = (undefined2)uVar9;
        uStack_11e = (undefined2)((ulong)uVar9 >> 0x10);
        uStack_11c = (undefined2)((ulong)uVar9 >> 0x20);
        uStack_11a = (undefined2)((ulong)uVar9 >> 0x30);
        uStack_130 = (undefined2)uVar8;
        uStack_12e = (undefined2)((ulong)uVar8 >> 0x10);
        uStack_12c = (undefined2)((ulong)uVar8 >> 0x20);
        uStack_12a = (undefined2)((ulong)uVar8 >> 0x30);
        uVar9 = *(undefined8 *)((long)auStack_91e8 + lVar50 + 8);
        uVar8 = *(undefined8 *)((long)auStack_90e8 + lVar50 + 8);
        uStack_140 = (undefined2)uVar9;
        uStack_13e = (undefined2)((ulong)uVar9 >> 0x10);
        uStack_13c = (undefined2)((ulong)uVar9 >> 0x20);
        uStack_13a = (undefined2)((ulong)uVar9 >> 0x30);
        uStack_150 = (undefined2)uVar8;
        uStack_14e = (undefined2)((ulong)uVar8 >> 0x10);
        uStack_14c = (undefined2)((ulong)uVar8 >> 0x20);
        uStack_14a = (undefined2)((ulong)uVar8 >> 0x30);
        uVar9 = *(undefined8 *)((long)auStack_8fe8 + lVar50 + 8);
        uVar8 = *(undefined8 *)((long)auStack_8ee8 + lVar50 + 8);
        uStack_160 = (undefined2)uVar9;
        uStack_15e = (undefined2)((ulong)uVar9 >> 0x10);
        uStack_15c = (undefined2)((ulong)uVar9 >> 0x20);
        uStack_15a = (undefined2)((ulong)uVar9 >> 0x30);
        uStack_170 = (undefined2)uVar8;
        uStack_16e = (undefined2)((ulong)uVar8 >> 0x10);
        uStack_16c = (undefined2)((ulong)uVar8 >> 0x20);
        uStack_16a = (undefined2)((ulong)uVar8 >> 0x30);
        auVar17._2_2_ = uStack_110;
        auVar17._0_2_ = uStack_100;
        auVar17._4_2_ = uStack_fe;
        auVar17._6_2_ = uStack_10e;
        auVar17._10_2_ = uStack_10c;
        auVar17._8_2_ = uStack_fc;
        auVar17._12_2_ = uStack_fa;
        auVar17._14_2_ = uStack_10a;
        auVar16._8_8_ = CONCAT44(local_a58,local_a58);
        auVar16._0_8_ = local_9848;
        auVar53 = pmaddwd(auVar17,auVar16);
        auVar15._2_2_ = uStack_130;
        auVar15._0_2_ = uStack_120;
        auVar15._4_2_ = uStack_11e;
        auVar15._6_2_ = uStack_12e;
        auVar15._10_2_ = uStack_12c;
        auVar15._8_2_ = uStack_11c;
        auVar15._12_2_ = uStack_11a;
        auVar15._14_2_ = uStack_12a;
        auVar14._12_4_ = uStack_a64;
        auVar14._8_4_ = uStack_910;
        auVar14._0_8_ = local_9858;
        auVar54 = pmaddwd(auVar15,auVar14);
        auVar13._2_2_ = uStack_150;
        auVar13._0_2_ = uStack_140;
        auVar13._4_2_ = uStack_13e;
        auVar13._6_2_ = uStack_14e;
        auVar13._10_2_ = uStack_14c;
        auVar13._8_2_ = uStack_13c;
        auVar13._12_2_ = uStack_13a;
        auVar13._14_2_ = uStack_14a;
        auVar12._8_8_ = CONCAT44(uStack_9f0,uStack_9f0);
        auVar12._0_8_ = local_9868;
        auVar55 = pmaddwd(auVar13,auVar12);
        auVar11._2_2_ = uStack_170;
        auVar11._0_2_ = uStack_160;
        auVar11._4_2_ = uStack_15e;
        auVar11._6_2_ = uStack_16e;
        auVar11._10_2_ = uStack_16c;
        auVar11._8_2_ = uStack_15c;
        auVar11._12_2_ = uStack_15a;
        auVar11._14_2_ = uStack_16a;
        auVar10._12_4_ = uStack_9fc;
        auVar10._8_4_ = uStack_930;
        auVar10._0_8_ = local_9878;
        auVar58 = pmaddwd(auVar11,auVar10);
        local_488 = auVar53._0_4_;
        iStack_484 = auVar53._4_4_;
        iStack_480 = auVar53._8_4_;
        iStack_47c = auVar53._12_4_;
        local_498 = auVar54._0_4_;
        iStack_494 = auVar54._4_4_;
        iStack_490 = auVar54._8_4_;
        iStack_48c = auVar54._12_4_;
        local_4a8 = auVar55._0_4_;
        iStack_4a4 = auVar55._4_4_;
        iStack_4a0 = auVar55._8_4_;
        iStack_49c = auVar55._12_4_;
        local_4b8 = auVar58._0_4_;
        iStack_4b4 = auVar58._4_4_;
        iStack_4b0 = auVar58._8_4_;
        iStack_4ac = auVar58._12_4_;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = local_898;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = local_898;
        iStack_52c = (int)(CONCAT26(uStack_12,CONCAT24(local_14,iVar51)) >> 0x20);
        auVar36._8_8_ = 0;
        auVar36._0_8_ = local_8b8;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = local_8b8;
        auVar42._4_4_ =
             (local_488 + local_498 + local_4a8 + local_4b8 + iVar46 >> auVar38) + iVar51 >> auVar36
        ;
        auVar42._0_4_ =
             (local_428 + local_438 + local_448 + local_458 + iVar46 >> auVar38) + iVar51 >> auVar36
        ;
        auVar42._12_4_ =
             (iStack_484 + iStack_494 + iStack_4a4 + iStack_4b4 + iVar46 >> auVar38) + iStack_52c >>
             auVar36;
        auVar42._8_4_ =
             (iStack_424 + iStack_434 + iStack_444 + iStack_454 + iVar46 >> auVar38) + iVar51 >>
             auVar36;
        auVar41._4_4_ =
             (iStack_480 + iStack_490 + iStack_4a0 + iStack_4b0 + iVar46 >> auVar37) + iVar51 >>
             auVar35;
        auVar41._0_4_ =
             (iStack_420 + iStack_430 + iStack_440 + iStack_450 + iVar46 >> auVar37) + iVar51 >>
             auVar35;
        auVar41._12_4_ =
             (iStack_47c + iStack_48c + iStack_49c + iStack_4ac + iVar46 >> auVar37) + iStack_52c >>
             auVar35;
        auVar41._8_4_ =
             (iStack_41c + iStack_42c + iStack_43c + iStack_44c + iVar46 >> auVar37) + iVar51 >>
             auVar35;
        auVar53 = packssdw(auVar42,auVar41);
        local_e8 = auVar53._0_2_;
        sStack_e6 = auVar53._2_2_;
        sStack_e4 = auVar53._4_2_;
        sStack_e2 = auVar53._6_2_;
        sStack_e0 = auVar53._8_2_;
        sStack_de = auVar53._10_2_;
        sStack_dc = auVar53._12_2_;
        sStack_da = auVar53._14_2_;
        cVar4 = (0 < local_e8) * (local_e8 < 0x100) * auVar53[0] - (0xff < local_e8);
        cVar5 = (0 < sStack_e6) * (sStack_e6 < 0x100) * auVar53[2] - (0xff < sStack_e6);
        cVar6 = (0 < sStack_e4) * (sStack_e4 < 0x100) * auVar53[4] - (0xff < sStack_e4);
        cVar7 = (0 < sStack_e2) * (sStack_e2 < 0x100) * auVar53[6] - (0xff < sStack_e2);
        puVar49 = (undefined8 *)(in_RDX + (local_95f4 * in_ECX + local_95f8));
        if (in_R8D == 2) {
          *(ushort *)puVar49 = CONCAT11(cVar5,cVar4);
        }
        else if (in_R8D == 4) {
          *(uint *)puVar49 = CONCAT13(cVar7,CONCAT12(cVar6,CONCAT11(cVar5,cVar4)));
        }
        else {
          *puVar49 = CONCAT17((0 < sStack_da) * (sStack_da < 0x100) * auVar53[0xe] -
                              (0xff < sStack_da),
                              CONCAT16((0 < sStack_dc) * (sStack_dc < 0x100) * auVar53[0xc] -
                                       (0xff < sStack_dc),
                                       CONCAT15((0 < sStack_de) * (sStack_de < 0x100) * auVar53[10]
                                                - (0xff < sStack_de),
                                                CONCAT14((0 < sStack_e0) * (sStack_e0 < 0x100) *
                                                         auVar53[8] - (0xff < sStack_e0),
                                                         CONCAT13(cVar7,CONCAT12(cVar6,CONCAT11(
                                                  cVar5,cVar4)))))));
        }
      }
    }
  }
  else if (in_R8D < 8) {
    av1_convolve_2d_sr_c
              (in_stack_fffffffffffff110,in_stack_fffffffffffff10c,in_stack_fffffffffffff100,
               in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8,in_stack_fffffffffffff0f4,
               in_stack_fffffffffffff120,in_stack_fffffffffffff128,in_stack_fffffffffffff130,
               in_stack_fffffffffffff138,in_stack_fffffffffffff140);
  }
  else {
    convolve_2d_sr_12tap_sse2
              (in_stack_fffffffffffff5d8,(int)((ulong)in_stack_fffffffffffff5d0 >> 0x20),
               in_stack_fffffffffffff5c8,(int)((ulong)in_stack_fffffffffffff5c0 >> 0x20),
               (int)in_stack_fffffffffffff5c0,(int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
               (InterpFilterParams *)round_shift_1[0],(InterpFilterParams *)round_shift_1[1],
               (int)round_const_1[0],(int)round_const_1[1],(ConvolveParams *)sum_shift[0]);
  }
  return;
}

Assistant:

void av1_convolve_2d_sr_sse2(const uint8_t *src, int src_stride, uint8_t *dst,
                             int dst_stride, int w, int h,
                             const InterpFilterParams *filter_params_x,
                             const InterpFilterParams *filter_params_y,
                             const int subpel_x_qn, const int subpel_y_qn,
                             ConvolveParams *conv_params) {
  if (filter_params_x->taps > 8) {
    if (w < 8) {
      av1_convolve_2d_sr_c(src, src_stride, dst, dst_stride, w, h,
                           filter_params_x, filter_params_y, subpel_x_qn,
                           subpel_y_qn, conv_params);
    } else {
      convolve_2d_sr_12tap_sse2(src, src_stride, dst, dst_stride, w, h,
                                filter_params_x, filter_params_y, subpel_x_qn,
                                subpel_y_qn, conv_params);
    }
  } else {
    const int bd = 8;

    DECLARE_ALIGNED(16, int16_t,
                    im_block[(MAX_SB_SIZE + MAX_FILTER_TAP - 1) * MAX_SB_SIZE]);
    int im_h = h + filter_params_y->taps - 1;
    int im_stride = MAX_SB_SIZE;
    int i, j;
    const int fo_vert = filter_params_y->taps / 2 - 1;
    const int fo_horiz = filter_params_x->taps / 2 - 1;
    const uint8_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;

    const __m128i zero = _mm_setzero_si128();
    const int bits =
        FILTER_BITS * 2 - conv_params->round_0 - conv_params->round_1;
    const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;

    assert(conv_params->round_0 > 0);

    /* Horizontal filter */
    {
      const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
          filter_params_x, subpel_x_qn & SUBPEL_MASK);
      const __m128i coeffs_x = _mm_loadu_si128((__m128i *)x_filter);

      // coeffs 0 1 0 1 2 3 2 3
      const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_x, coeffs_x);
      // coeffs 4 5 4 5 6 7 6 7
      const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_x, coeffs_x);

      // coeffs 0 1 0 1 0 1 0 1
      const __m128i coeff_01 = _mm_unpacklo_epi64(tmp_0, tmp_0);
      // coeffs 2 3 2 3 2 3 2 3
      const __m128i coeff_23 = _mm_unpackhi_epi64(tmp_0, tmp_0);
      // coeffs 4 5 4 5 4 5 4 5
      const __m128i coeff_45 = _mm_unpacklo_epi64(tmp_1, tmp_1);
      // coeffs 6 7 6 7 6 7 6 7
      const __m128i coeff_67 = _mm_unpackhi_epi64(tmp_1, tmp_1);

      const __m128i round_const = _mm_set1_epi32(
          (1 << (bd + FILTER_BITS - 1)) + ((1 << conv_params->round_0) >> 1));
      const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_0);

      for (i = 0; i < im_h; ++i) {
        for (j = 0; j < w; j += 8) {
          const __m128i data =
              _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);

          // Filter even-index pixels
          const __m128i src_0 = _mm_unpacklo_epi8(data, zero);
          const __m128i res_0 = _mm_madd_epi16(src_0, coeff_01);
          const __m128i src_2 =
              _mm_unpacklo_epi8(_mm_srli_si128(data, 2), zero);
          const __m128i res_2 = _mm_madd_epi16(src_2, coeff_23);
          const __m128i src_4 =
              _mm_unpacklo_epi8(_mm_srli_si128(data, 4), zero);
          const __m128i res_4 = _mm_madd_epi16(src_4, coeff_45);
          const __m128i src_6 =
              _mm_unpacklo_epi8(_mm_srli_si128(data, 6), zero);
          const __m128i res_6 = _mm_madd_epi16(src_6, coeff_67);

          __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_4),
                                           _mm_add_epi32(res_2, res_6));
          res_even =
              _mm_sra_epi32(_mm_add_epi32(res_even, round_const), round_shift);

          // Filter odd-index pixels
          const __m128i src_1 =
              _mm_unpacklo_epi8(_mm_srli_si128(data, 1), zero);
          const __m128i res_1 = _mm_madd_epi16(src_1, coeff_01);
          const __m128i src_3 =
              _mm_unpacklo_epi8(_mm_srli_si128(data, 3), zero);
          const __m128i res_3 = _mm_madd_epi16(src_3, coeff_23);
          const __m128i src_5 =
              _mm_unpacklo_epi8(_mm_srli_si128(data, 5), zero);
          const __m128i res_5 = _mm_madd_epi16(src_5, coeff_45);
          const __m128i src_7 =
              _mm_unpacklo_epi8(_mm_srli_si128(data, 7), zero);
          const __m128i res_7 = _mm_madd_epi16(src_7, coeff_67);

          __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_5),
                                          _mm_add_epi32(res_3, res_7));
          res_odd =
              _mm_sra_epi32(_mm_add_epi32(res_odd, round_const), round_shift);

          // Pack in the column order 0, 2, 4, 6, 1, 3, 5, 7
          __m128i res = _mm_packs_epi32(res_even, res_odd);
          _mm_storeu_si128((__m128i *)&im_block[i * im_stride + j], res);
        }
      }
    }

    /* Vertical filter */
    {
      const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
          filter_params_y, subpel_y_qn & SUBPEL_MASK);
      const __m128i coeffs_y = _mm_loadu_si128((__m128i *)y_filter);

      // coeffs 0 1 0 1 2 3 2 3
      const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_y, coeffs_y);
      // coeffs 4 5 4 5 6 7 6 7
      const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_y, coeffs_y);

      // coeffs 0 1 0 1 0 1 0 1
      const __m128i coeff_01 = _mm_unpacklo_epi64(tmp_0, tmp_0);
      // coeffs 2 3 2 3 2 3 2 3
      const __m128i coeff_23 = _mm_unpackhi_epi64(tmp_0, tmp_0);
      // coeffs 4 5 4 5 4 5 4 5
      const __m128i coeff_45 = _mm_unpacklo_epi64(tmp_1, tmp_1);
      // coeffs 6 7 6 7 6 7 6 7
      const __m128i coeff_67 = _mm_unpackhi_epi64(tmp_1, tmp_1);

      const __m128i sum_round = _mm_set1_epi32(
          (1 << offset_bits) + ((1 << conv_params->round_1) >> 1));
      const __m128i sum_shift = _mm_cvtsi32_si128(conv_params->round_1);

      const __m128i round_const = _mm_set1_epi32(
          ((1 << bits) >> 1) - (1 << (offset_bits - conv_params->round_1)) -
          ((1 << (offset_bits - conv_params->round_1)) >> 1));
      const __m128i round_shift = _mm_cvtsi32_si128(bits);

      for (i = 0; i < h; ++i) {
        for (j = 0; j < w; j += 8) {
          // Filter even-index pixels
          const int16_t *data = &im_block[i * im_stride + j];
          const __m128i src_0 =
              _mm_unpacklo_epi16(*(__m128i *)(data + 0 * im_stride),
                                 *(__m128i *)(data + 1 * im_stride));
          const __m128i src_2 =
              _mm_unpacklo_epi16(*(__m128i *)(data + 2 * im_stride),
                                 *(__m128i *)(data + 3 * im_stride));
          const __m128i src_4 =
              _mm_unpacklo_epi16(*(__m128i *)(data + 4 * im_stride),
                                 *(__m128i *)(data + 5 * im_stride));
          const __m128i src_6 =
              _mm_unpacklo_epi16(*(__m128i *)(data + 6 * im_stride),
                                 *(__m128i *)(data + 7 * im_stride));

          const __m128i res_0 = _mm_madd_epi16(src_0, coeff_01);
          const __m128i res_2 = _mm_madd_epi16(src_2, coeff_23);
          const __m128i res_4 = _mm_madd_epi16(src_4, coeff_45);
          const __m128i res_6 = _mm_madd_epi16(src_6, coeff_67);

          const __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_2),
                                                 _mm_add_epi32(res_4, res_6));

          // Filter odd-index pixels
          const __m128i src_1 =
              _mm_unpackhi_epi16(*(__m128i *)(data + 0 * im_stride),
                                 *(__m128i *)(data + 1 * im_stride));
          const __m128i src_3 =
              _mm_unpackhi_epi16(*(__m128i *)(data + 2 * im_stride),
                                 *(__m128i *)(data + 3 * im_stride));
          const __m128i src_5 =
              _mm_unpackhi_epi16(*(__m128i *)(data + 4 * im_stride),
                                 *(__m128i *)(data + 5 * im_stride));
          const __m128i src_7 =
              _mm_unpackhi_epi16(*(__m128i *)(data + 6 * im_stride),
                                 *(__m128i *)(data + 7 * im_stride));

          const __m128i res_1 = _mm_madd_epi16(src_1, coeff_01);
          const __m128i res_3 = _mm_madd_epi16(src_3, coeff_23);
          const __m128i res_5 = _mm_madd_epi16(src_5, coeff_45);
          const __m128i res_7 = _mm_madd_epi16(src_7, coeff_67);

          const __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_3),
                                                _mm_add_epi32(res_5, res_7));

          // Rearrange pixels back into the order 0 ... 7
          const __m128i res_lo = _mm_unpacklo_epi32(res_even, res_odd);
          const __m128i res_hi = _mm_unpackhi_epi32(res_even, res_odd);

          __m128i res_lo_round =
              _mm_sra_epi32(_mm_add_epi32(res_lo, sum_round), sum_shift);
          __m128i res_hi_round =
              _mm_sra_epi32(_mm_add_epi32(res_hi, sum_round), sum_shift);

          res_lo_round = _mm_sra_epi32(_mm_add_epi32(res_lo_round, round_const),
                                       round_shift);
          res_hi_round = _mm_sra_epi32(_mm_add_epi32(res_hi_round, round_const),
                                       round_shift);

          const __m128i res16 = _mm_packs_epi32(res_lo_round, res_hi_round);
          const __m128i res = _mm_packus_epi16(res16, res16);

          // Accumulate values into the destination buffer
          __m128i *const p = (__m128i *)&dst[i * dst_stride + j];

          if (w == 2) {
            *(uint16_t *)p = (uint16_t)_mm_cvtsi128_si32(res);
          } else if (w == 4) {
            *(int *)p = _mm_cvtsi128_si32(res);
          } else {
            _mm_storel_epi64(p, res);
          }
        }
      }
    }
  }
}